

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readskel.c
# Opt level: O1

void read_skel(char *name)

{
  bool bVar1;
  bool bVar2;
  char **ppcVar3;
  uint uVar4;
  int iVar5;
  FILE *__stream;
  char *pcVar6;
  size_t sVar7;
  long lVar8;
  ushort **ppuVar9;
  long lVar10;
  char *pcVar11;
  uint uVar12;
  char *__s2;
  section *psVar13;
  char cVar14;
  ulong uVar15;
  uint uVar16;
  char buf [256];
  char local_138 [264];
  
  __stream = fopen(name,"r");
  if (__stream == (FILE *)0x0) {
    open_error(name);
  }
  uVar15 = 0xfffffffe;
  uVar16 = 0;
  bVar2 = true;
  do {
    while( true ) {
      do {
        pcVar6 = fgets(local_138,0xff,__stream);
        iVar5 = (int)uVar15;
        if (pcVar6 == (char *)0x0) {
          if (-1 < iVar5) {
            add_ptr((char *)0x0);
            ppcVar3 = ap_start;
            ap_start = ap;
            section_list[uVar15].ptr = ppcVar3;
          }
          if (iVar5 == -2) {
            error(0,(char *)0x0,(char *)0x0,"No sections found in skeleton file \"%s\"",name);
          }
          return;
        }
        uVar16 = uVar16 + bVar2;
        pcVar6 = local_138;
        sVar7 = strlen(local_138);
      } while ((int)sVar7 == 0);
      lVar8 = sVar7 << 0x20;
      lVar10 = lVar8 + -0x100000000 >> 0x20;
      cVar14 = local_138[lVar10];
      if (cVar14 != '\n') {
        local_138[lVar8 >> 0x20] = '\\';
        lVar10 = lVar8 + 0x100000000 >> 0x20;
      }
      bVar1 = cVar14 == '\n';
      local_138[lVar10] = '\0';
      if (((bVar2) && (local_138[0] == '%')) && (local_138[1] == '%')) break;
      bVar2 = bVar1;
      if (-1 < iVar5) {
        add_string(local_138);
      }
    }
    if (-1 < iVar5) {
      pcVar6 = (char *)0x0;
      add_ptr((char *)0x0);
      ppcVar3 = ap_start;
      ap_start = ap;
      section_list[uVar15].ptr = ppcVar3;
    }
    cVar14 = local_138[2];
    if (local_138[2] == '\0') {
      __s2 = local_138 + 2;
    }
    else {
      ppuVar9 = __ctype_b_loc();
      __s2 = local_138 + 2;
      do {
        if ((*(byte *)((long)*ppuVar9 + (long)cVar14 * 2 + 1) & 0x20) == 0) break;
        cVar14 = __s2[1];
        __s2 = __s2 + 1;
      } while (cVar14 != '\0');
    }
    ppuVar9 = __ctype_b_loc();
    pcVar11 = __s2;
    if ((*(byte *)((long)*ppuVar9 + (long)cVar14 * 2 + 1) & 4) == 0) {
      uVar4 = 0xffffffff;
    }
    else {
      do {
        pcVar11 = pcVar11 + 1;
      } while (((*ppuVar9)[*pcVar11] & 8) != 0);
      *pcVar11 = '\0';
      uVar4 = 0xffffffff;
      pcVar6 = section_list[0].name;
      if (section_list[0].name != (char *)0x0) {
        uVar12 = 0;
        psVar13 = section_list;
        do {
          psVar13 = psVar13 + 1;
          iVar5 = strcmp(pcVar6,__s2);
          if (iVar5 == 0) {
            uVar4 = uVar12;
          }
          pcVar6 = psVar13->name;
          uVar12 = uVar12 + 1;
        } while (pcVar6 != (char *)0x0);
      }
    }
    uVar15 = (ulong)uVar4;
    if ((int)uVar4 < 0) {
      bVar2 = bVar1;
      if (*__s2 != '\0') {
        error(0,local_138,__s2,"line %d of \"%s\", bad section name",(ulong)uVar16,name);
      }
    }
    else {
      add_fmt(pcVar6,(ulong)(uVar16 + 1),name);
      bVar2 = bVar1;
    }
  } while( true );
}

Assistant:

void read_skel(char *name)
{
char	buf[256];
int	section = -2;
int	line = 0, sline = 1, eline = 1;
int	i;
FILE	*fp;

    if (!(fp = fopen(name, "r")))
	open_error(name);
    while(fgets(buf, 255, fp)) {
	if ((sline = eline))
	    line++;
	if ((i = strlen(buf)) == 0)
	    continue;
	if (buf[i-1] == '\n') {
	    buf[--i] = 0;
	    eline = 1;
	} else {
	    buf[i++] = '\\';
	    buf[i] = 0;
	    eline = 0;
	}
	if (sline && buf[0] == '%' && buf[1] == '%') {
	    char *p = buf+2;
	    if (section >= 0) {
	      section_list[section].ptr = fin_section();
	    }
	    section = -1;
	    while(*p && isspace(*p)) p++;
	    if (isalpha(*p)) {
	      char *e = p;
	      while(isalnum(*++e));
	      *e = 0;
	      for (i=0; section_list[i].name; i++)
		if (!strcmp(section_list[i].name, p))
		  section = i;
	    }
	    if (section >= 0)
	      add_fmt("#line %d \"%s\"", line+1, name);
	    else if (*p)
	      error(0, buf, p, "line %d of \"%s\", bad section name",
		    line, name);
        } else if (section >= 0) {
	    add_string(buf);
	}
    }
    if (section >= 0)
	section_list[section].ptr = fin_section();
    if (section == -2)
	error(0, 0, 0, "No sections found in skeleton file \"%s\"", name);
}